

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hand.cpp
# Opt level: O1

void __thiscall
Hand::getFingers(Hand *this,vector<ShortFinger,_std::allocator<ShortFinger>_> *lastFingers)

{
  vector<Finger,_std::allocator<Finger>_> *this_00;
  double dVar1;
  double dVar2;
  int iVar3;
  pointer pVVar4;
  pointer pFVar5;
  pointer pFVar6;
  undefined4 uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  size_type __new_size;
  __normal_iterator<Finger_*,_std::vector<Finger,_std::allocator<Finger>_>_> __i;
  pointer pFVar11;
  pointer pFVar12;
  Vec4i *v;
  pointer defect;
  pointer pFVar13;
  _InputArray local_c8;
  Hand *local_b0;
  pointer local_a8;
  Finger f;
  _OutputArray local_48;
  
  if ((this->contour).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
      .super__Vector_impl_data._M_start ==
      (this->contour).super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    this->ok = false;
  }
  else {
    f.ptFar.x = 0;
    f.ptFar.y = 0;
    f.ptStart.x = -0x7efcfff4;
    local_c8.obj = &this->hull;
    local_c8.sz.width = 0;
    local_c8.sz.height = 0;
    local_c8.flags = -0x7dfcfff4;
    f.ptEnd = (Point)this;
    cv::convexHull((_InputArray *)&f,(_OutputArray *)&local_c8,false,true);
    f.ptFar.x = 0;
    f.ptFar.y = 0;
    f.ptStart.x = -0x7efcfff4;
    local_c8.sz.width = 0;
    local_c8.sz.height = 0;
    local_c8.flags = -0x7dfcfffc;
    local_c8.obj = &this->hullI;
    f.ptEnd = (Point)this;
    cv::convexHull((_InputArray *)&f,(_OutputArray *)&local_c8,false,true);
    f.ptFar.x = 0;
    f.ptFar.y = 0;
    f.ptStart.x = -0x7efcfff4;
    local_c8.sz.width = 0;
    local_c8.sz.height = 0;
    local_c8.flags = -0x7efcfffc;
    local_48.super__InputArray.obj = &this->defects;
    local_48.super__InputArray.sz.width = 0;
    local_48.super__InputArray.sz.height = 0;
    local_48.super__InputArray.flags = -0x7dfcffe4;
    local_c8.obj = &this->hullI;
    f.ptEnd = (Point)this;
    cv::convexityDefects((_InputArray *)&f,&local_c8,&local_48);
    defect = (this->defects).super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4 = (this->defects).super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (defect != pVVar4) {
      do {
        Finger::Finger(&f,defect,&this->contour,&this->border,this->maxAngle,this->shouldCheckAngles
                       ,true,-1);
        if (f.ok == true) {
          std::vector<Finger,_std::allocator<Finger>_>::push_back(&this->fingers,&f);
        }
        defect = defect + 1;
      } while (defect != pVVar4);
    }
    pFVar12 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar5 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar12 != pFVar5) {
      uVar9 = (long)pFVar5 - (long)pFVar12 >> 6;
      lVar10 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                (pFVar12,pFVar5,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pFVar5 - (long)pFVar12 < 0x401) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                  (pFVar12,pFVar5);
      }
      else {
        pFVar11 = pFVar12 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,__gnu_cxx::__ops::_Iter_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                  (pFVar12,pFVar11);
        for (; pFVar11 != pFVar5; pFVar11 = pFVar11 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Finger*,std::vector<Finger,std::allocator<Finger>>>,__gnu_cxx::__ops::_Val_comp_iter<Hand::getFingers(std::vector<ShortFinger,std::allocator<ShortFinger>>const&)::__0>>
                    (pFVar11);
        }
      }
    }
    this_00 = &this->fingers;
    removeCloseFingertips(this);
    dVar1 = this->area;
    dVar2 = *(double *)&this->field_0x98;
    (this->center).x = (int)(*(double *)&this->field_0x90 / dVar1);
    (this->center).y = (int)(dVar2 / dVar1);
    getFingersIndexes(this,lastFingers);
    __new_size = (size_type)this->maxFingers;
    if ((__new_size != 0xffffffffffffffff) &&
       (__new_size <
        (ulong)((long)(this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                      super__Vector_impl_data._M_start >> 6))) {
      std::vector<Finger,_std::allocator<Finger>_>::resize(this_00,__new_size);
    }
    if ((this->maxFingers != -1 & this->shouldGetLast) == 1) {
      pFVar12 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar5 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar10 = (long)pFVar5 - (long)pFVar12;
      local_b0 = this;
      if ((ulong)(lVar10 >> 6) < (ulong)(long)this->maxFingers && lVar10 != 0) {
        do {
          if (((long)this->maxFingers == 0xffffffffffffffff) ||
             (iVar8 = 4,
             (ulong)((long)(this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 6) <
             (ulong)(long)this->maxFingers)) {
            pFVar11 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pFVar6 = (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            iVar8 = (pFVar12->ptEnd).x;
            iVar3 = (pFVar12->ptEnd).y;
            lVar10 = (long)pFVar6 - (long)pFVar11 >> 8;
            if (0 < lVar10) {
              lVar10 = lVar10 + 1;
              pFVar11 = pFVar11 + 2;
              local_a8 = pFVar12;
              do {
                pFVar13 = pFVar11;
                local_c8.flags = pFVar13[-2].ptStart.x;
                local_c8._4_4_ = pFVar13[-2].ptStart.y;
                f.ptStart.x = iVar8;
                f.ptStart.y = iVar3;
                dVar1 = getDist(&f.ptStart,(Point *)&local_c8);
                if (dVar1 <= 50.0) {
                  this = local_b0;
                  pFVar12 = local_a8;
                  pFVar13 = pFVar13 + -2;
                  goto LAB_001098bf;
                }
                local_c8.flags = pFVar13[-1].ptStart.x;
                local_c8._4_4_ = pFVar13[-1].ptStart.y;
                f.ptStart.x = iVar8;
                f.ptStart.y = iVar3;
                dVar1 = getDist(&f.ptStart,(Point *)&local_c8);
                if (dVar1 <= 50.0) {
                  this = local_b0;
                  pFVar12 = local_a8;
                  pFVar13 = pFVar13 + -1;
                  goto LAB_001098bf;
                }
                local_c8.flags = (pFVar13->ptStart).x;
                local_c8._4_4_ = (pFVar13->ptStart).y;
                f.ptStart.x = iVar8;
                f.ptStart.y = iVar3;
                dVar1 = getDist(&f.ptStart,(Point *)&local_c8);
                this = local_b0;
                pFVar12 = local_a8;
                if (dVar1 <= 50.0) goto LAB_001098bf;
                local_c8.flags = pFVar13[1].ptStart.x;
                local_c8._4_4_ = pFVar13[1].ptStart.y;
                f.ptStart.x = iVar8;
                f.ptStart.y = iVar3;
                dVar1 = getDist(&f.ptStart,(Point *)&local_c8);
                this = local_b0;
                pFVar12 = local_a8;
                if (dVar1 <= 50.0) {
                  pFVar13 = pFVar13 + 1;
                  goto LAB_001098bf;
                }
                lVar10 = lVar10 + -1;
                pFVar11 = pFVar13 + 4;
              } while (1 < lVar10);
              pFVar11 = pFVar13 + 2;
            }
            lVar10 = (long)pFVar6 - (long)pFVar11 >> 6;
            if (lVar10 == 1) {
LAB_00109873:
              local_c8.flags = (pFVar11->ptStart).x;
              local_c8._4_4_ = (pFVar11->ptStart).y;
              f.ptStart.x = iVar8;
              f.ptStart.y = iVar3;
              dVar1 = getDist(&f.ptStart,(Point *)&local_c8);
              pFVar13 = pFVar11;
              if (50.0 < dVar1) {
                pFVar13 = pFVar6;
              }
            }
            else if (lVar10 == 2) {
LAB_00109831:
              local_c8.flags = (pFVar11->ptStart).x;
              local_c8._4_4_ = (pFVar11->ptStart).y;
              f.ptStart.x = iVar8;
              f.ptStart.y = iVar3;
              dVar1 = getDist(&f.ptStart,(Point *)&local_c8);
              pFVar13 = pFVar11;
              if (50.0 < dVar1) {
                pFVar11 = pFVar11 + 1;
                goto LAB_00109873;
              }
            }
            else {
              pFVar13 = pFVar6;
              if (lVar10 == 3) {
                local_c8.flags = (pFVar11->ptStart).x;
                local_c8._4_4_ = (pFVar11->ptStart).y;
                f.ptStart.x = iVar8;
                f.ptStart.y = iVar3;
                dVar1 = getDist(&f.ptStart,(Point *)&local_c8);
                pFVar13 = pFVar11;
                if (50.0 < dVar1) {
                  pFVar11 = pFVar11 + 1;
                  goto LAB_00109831;
                }
              }
            }
LAB_001098bf:
            iVar8 = 5;
            if (pFVar13 ==
                (this->fingers).super__Vector_base<Finger,_std::allocator<Finger>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              f.ptFar = pFVar12->ptFar;
              uVar7 = pFVar12->hndAngle;
              f.depth = pFVar12->depth;
              f.maxAngle = pFVar12->maxAngle;
              f.minDepth = pFVar12->minDepth;
              f.ok = pFVar12->ok;
              f.shouldCheckAngles = pFVar12->shouldCheckAngles;
              f.shouldCheckDist = pFVar12->shouldCheckDist;
              f._39_1_ = pFVar12->field_0x27;
              f.boundingBox.x = (pFVar12->boundingBox).x;
              f.boundingBox.y = (pFVar12->boundingBox).y;
              f.boundingBox.width = (pFVar12->boundingBox).width;
              f.boundingBox.height = (pFVar12->boundingBox).height;
              f.ptStart.x = (pFVar12->ptEnd).x;
              f.ptStart.y = (pFVar12->ptEnd).y;
              f.ptEnd = pFVar12->ptStart;
              f.hndAngle = uVar7;
              f.index = -1;
              std::vector<Finger,std::allocator<Finger>>::emplace_back<Finger&>
                        ((vector<Finger,std::allocator<Finger>> *)this_00,&f);
              iVar8 = 0;
            }
          }
        } while (((iVar8 == 5) || (iVar8 == 0)) && (pFVar12 = pFVar12 + 1, pFVar12 != pFVar5));
      }
    }
  }
  return;
}

Assistant:

void Hand::getFingers(const vector<ShortFinger> &lastFingers) {
    if (contour.empty()) {
        ok = false;
        return;
    }
    convexHull(contour, hull, false);
    convexHull(contour, hullI, false);
    convexityDefects(contour, hullI, defects);

    for (const Vec4i &v : defects) {
        Finger f(v, contour, border, maxAngle, shouldCheckAngles);
        if (f.ok)
            fingers.push_back(f);
    }
    sort(fingers.begin(), fingers.end(), [](const Finger &a, const Finger &b) {
        return a.ptStart.y < b.ptStart.y;
    });
    removeCloseFingertips();
    getCenter();
    getFingersIndexes(lastFingers);
    if (maxFingers != -1 && fingers.size() > maxFingers)
        fingers.resize(maxFingers);

    if (shouldGetLast) {
        if (maxFingers != -1 && fingers.size() < maxFingers) {
            for (const Finger &f : fingers) {
                if (maxFingers != -1 && fingers.size() >= maxFingers)
                    break;
                auto fnd = find_if(fingers.begin(), fingers.end(), [f](const Finger &b) {
                    return getDist(f.ptEnd, b.ptStart) <= 50;
                });
                if (fnd != fingers.end())
                    continue;

                Finger nf = f;
                nf.ptStart = f.ptEnd;
                nf.ptEnd = f.ptStart;
                nf.index = -1;
                fingers.emplace_back(nf);
            }
        }
    }
}